

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDVertex::MarkedFaceCount(ON_SubDVertex *this)

{
  bool bVar1;
  uint uVar2;
  unsigned_short vfi;
  ulong uVar3;
  
  uVar2 = 0;
  for (uVar3 = 0; uVar3 < this->m_face_count; uVar3 = uVar3 + 1) {
    if (this->m_faces[uVar3] != (ON_SubDFace *)0x0) {
      bVar1 = ON_ComponentStatus::RuntimeMark
                        (&(this->m_faces[uVar3]->super_ON_SubDComponentBase).m_status);
      uVar2 = uVar2 + bVar1;
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDVertex::MarkedFaceCount() const
{
  unsigned int mark_count = 0;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr != f && f->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}